

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxIkLink::PmxIkLink(PmxIkLink *this)

{
  int local_14;
  int i;
  PmxIkLink *this_local;
  
  this->link_target = 0;
  this->angle_lock = '\0';
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    this->max_radian[local_14] = 0.0;
    this->min_radian[local_14] = 0.0;
  }
  return;
}

Assistant:

PmxIkLink()
			: link_target(0)
			, angle_lock(0)
		{
			for (int i = 0; i < 3; ++i) {
				max_radian[i] = 0.0f;
				min_radian[i] = 0.0f;
			}
		}